

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

QModelIndex * __thiscall QColumnView::indexAt(QColumnView *this,QPoint *point)

{
  bool bVar1;
  QColumnViewPrivate *pQVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  QWidget *in_RDX;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int i;
  QColumnViewPrivate *d;
  QPoint adjustedPoint;
  QPoint topLeft;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_44;
  undefined1 *local_28;
  QRect local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QColumnView *)0x863464);
  for (local_44 = 0; qVar3 = QList<QAbstractItemView_*>::size(&pQVar2->columns), local_44 < qVar3;
      local_44 = local_44 + 1) {
    local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    QList<QAbstractItemView_*>::at
              ((QList<QAbstractItemView_*> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    local_20 = QWidget::frameGeometry(in_RDX);
    local_10 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                             );
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    in_stack_ffffffffffffff94 = QPoint::x((QPoint *)0x8634f6);
    QPoint::x((QPoint *)0x863504);
    QPoint::y((QPoint *)0x86351a);
    QPoint::y((QPoint *)0x863528);
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    ppQVar4 = QList<QAbstractItemView_*>::at
                        ((QList<QAbstractItemView_*> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    (**(code **)(*(long *)&((*ppQVar4)->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                0x1f0))(in_RDI,*ppQVar4,&local_28);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
    ;
    if (bVar1) goto LAB_008635bb;
  }
  QModelIndex::QModelIndex((QModelIndex *)0x8635bb);
LAB_008635bb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QModelIndex QColumnView::indexAt(const QPoint &point) const
{
    Q_D(const QColumnView);
    for (int i = 0; i < d->columns.size(); ++i) {
        QPoint topLeft = d->columns.at(i)->frameGeometry().topLeft();
        QPoint adjustedPoint(point.x() - topLeft.x(), point.y() - topLeft.y());
        QModelIndex index = d->columns.at(i)->indexAt(adjustedPoint);
        if (index.isValid())
            return index;
    }
    return QModelIndex();
}